

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O0

void __thiscall
QDnsLookup::QDnsLookup
          (QDnsLookup *this,Type type,QString *name,QHostAddress *nameserver,quint16 port,
          QObject *parent)

{
  QObjectPrivate *newValue;
  QDnsLookupPrivate *in_RDI;
  QObject *in_R9;
  QDnsLookupPrivate *d;
  
  newValue = (QObjectPrivate *)operator_new(0x1b0);
  QDnsLookupPrivate::QDnsLookupPrivate(in_RDI);
  QObject::QObject((QObject *)in_RDI,newValue,in_R9);
  *(undefined ***)in_RDI = &PTR_metaObject_0049f470;
  d_func((QDnsLookup *)0x33f2a4);
  QObjectBindableProperty<QDnsLookupPrivate,_QString,_&QDnsLookupPrivate::_qt_property_name_offset,_&QDnsLookupPrivate::nameChanged>
  ::operator=((QObjectBindableProperty<QDnsLookupPrivate,_QString,_&QDnsLookupPrivate::_qt_property_name_offset,_&QDnsLookupPrivate::nameChanged>
               *)in_RDI,(parameter_type)newValue);
  QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Type,_&QDnsLookupPrivate::_qt_property_type_offset,_&QDnsLookupPrivate::typeChanged>
  ::operator=((QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Type,_&QDnsLookupPrivate::_qt_property_type_offset,_&QDnsLookupPrivate::typeChanged>
               *)in_RDI,(parameter_type)((ulong)newValue >> 0x20));
  QObjectBindableProperty<QDnsLookupPrivate,_unsigned_short,_&QDnsLookupPrivate::_qt_property_port_offset,_&QDnsLookupPrivate::nameserverPortChanged>
  ::operator=((QObjectBindableProperty<QDnsLookupPrivate,_unsigned_short,_&QDnsLookupPrivate::_qt_property_port_offset,_&QDnsLookupPrivate::nameserverPortChanged>
               *)in_RDI,(parameter_type)((ulong)newValue >> 0x30));
  QObjectBindableProperty<QDnsLookupPrivate,_QHostAddress,_&QDnsLookupPrivate::_qt_property_nameserver_offset,_&QDnsLookupPrivate::nameserverChanged>
  ::operator=((QObjectBindableProperty<QDnsLookupPrivate,_QHostAddress,_&QDnsLookupPrivate::_qt_property_nameserver_offset,_&QDnsLookupPrivate::nameserverChanged>
               *)in_RDI,(parameter_type)newValue);
  return;
}

Assistant:

QDnsLookup::QDnsLookup(Type type, const QString &name, const QHostAddress &nameserver, quint16 port, QObject *parent)
    : QObject(*new QDnsLookupPrivate, parent)
{
    Q_D(QDnsLookup);
    d->name = name;
    d->type = type;
    d->port = port;
    d->nameserver = nameserver;
}